

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSim2.c
# Opt level: O2

Abc_Cex_t * Gia_Sim2GenerateCounter(Gia_Man_t *pAig,int iFrame,int iOut,int nWords,int iPat)

{
  byte bVar1;
  uint uVar2;
  Abc_Cex_t *pAVar3;
  void *__ptr;
  int iVar4;
  int iVar5;
  int iVar6;
  ulong uVar7;
  
  pAVar3 = Abc_CexAlloc(pAig->nRegs,pAig->vCis->nSize - pAig->nRegs,iFrame + 1);
  pAVar3->iFrame = iFrame;
  pAVar3->iPo = iOut;
  iVar4 = pAVar3->nRegs;
  __ptr = malloc((long)nWords * 4);
  bVar1 = (byte)iPat & 0x1f;
  for (iVar5 = 0 << bVar1; iVar5 <= iFrame; iVar5 = iVar5 + 1) {
    for (iVar6 = 0; uVar7 = (ulong)(uint)nWords, iVar6 < pAig->vCis->nSize - pAig->nRegs;
        iVar6 = iVar6 + 1) {
      for (; 0 < (int)uVar7; uVar7 = uVar7 - 1) {
        uVar2 = Gia_ManRandom(0);
        *(uint *)((long)__ptr + uVar7 * 4 + -4) = uVar2;
      }
      if ((*(uint *)((long)__ptr + (long)(iPat >> 5) * 4) & 1 << bVar1) != 0) {
        (&pAVar3[1].iPo)[iVar4 + iVar6 >> 5] =
             (&pAVar3[1].iPo)[iVar4 + iVar6 >> 5] | 1 << ((byte)(iVar4 + iVar6) & 0x1f);
      }
    }
    iVar4 = iVar4 + pAVar3->nPis;
  }
  free(__ptr);
  return pAVar3;
}

Assistant:

Abc_Cex_t * Gia_Sim2GenerateCounter( Gia_Man_t * pAig, int iFrame, int iOut, int nWords, int iPat )
{
    Abc_Cex_t * p;
    unsigned * pData;
    int f, i, w, Counter;
    p = Abc_CexAlloc( Gia_ManRegNum(pAig), Gia_ManPiNum(pAig), iFrame+1 );
    p->iFrame = iFrame;
    p->iPo = iOut;
    // fill in the binary data
    Counter = p->nRegs;
    pData = ABC_ALLOC( unsigned, nWords );
    for ( f = 0; f <= iFrame; f++, Counter += p->nPis )
    for ( i = 0; i < Gia_ManPiNum(pAig); i++ )
    {
        for ( w = nWords-1; w >= 0; w-- )
            pData[w] = Gia_ManRandom( 0 );
        if ( Abc_InfoHasBit( pData, iPat ) )
            Abc_InfoSetBit( p->pData, Counter + i );
    }
    ABC_FREE( pData );
    return p;
}